

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O2

LispPTR N_OP_igreaterp(LispPTR tosm1,LispPTR tos)

{
  ushort uVar1;
  LispPTR LVar2;
  LispPTR *pLVar3;
  float *pfVar4;
  LispPTR LVar5;
  LispPTR LVar6;
  
  if ((tosm1 & 0xfff0000) == 0xf0000) {
    LVar6 = tosm1 | 0xffff0000;
  }
  else if ((tosm1 & 0xfff0000) == 0xe0000) {
    LVar6 = tosm1 & 0xffff;
  }
  else {
    uVar1 = *(ushort *)((ulong)(tosm1 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
    if (uVar1 == 3) {
      pfVar4 = (float *)NativeAligned4FromLAddr(tosm1);
      if (*pfVar4 != 2.1474836e+09) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      LVar6 = (LispPTR)*pfVar4;
    }
    else {
      if (uVar1 != 2) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pLVar3 = NativeAligned4FromLAddr(tosm1);
      LVar6 = *pLVar3;
    }
  }
  if ((tos & 0xfff0000) == 0xf0000) {
    LVar5 = tos | 0xffff0000;
  }
  else if ((tos & 0xfff0000) == 0xe0000) {
    LVar5 = tos & 0xffff;
  }
  else {
    uVar1 = *(ushort *)((ulong)(tos >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
    if (uVar1 == 3) {
      pfVar4 = (float *)NativeAligned4FromLAddr(tos);
      if (*pfVar4 != 2.1474836e+09) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      LVar5 = (LispPTR)*pfVar4;
    }
    else {
      if (uVar1 != 2) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pLVar3 = NativeAligned4FromLAddr(tos);
      LVar5 = *pLVar3;
    }
  }
  LVar2 = 0x4c;
  if ((int)LVar6 <= (int)LVar5) {
    LVar2 = 0;
  }
  return LVar2;
}

Assistant:

LispPTR N_OP_igreaterp(LispPTR tosm1, LispPTR tos) {
  int arg1, arg2;

  N_IGETNUMBER(tosm1, arg1, do_ufn);
  N_IGETNUMBER(tos, arg2, do_ufn);

  if (arg1 > arg2)
    return (ATOM_T);
  else
    return (NIL_PTR);

do_ufn:
  ERROR_EXIT(tos);
}